

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

void __thiscall
Jupiter::HTTP::Server::Content::Content(Content *this,string *in_name,HTTPFunction *in_function)

{
  uint uVar1;
  
  this->_vptr_Content = (_func_int **)&PTR_execute_abi_cxx11__0015a308;
  this->free_result = true;
  std::__cxx11::string::string(&this->name,in_name);
  (this->charset)._M_len = 0;
  (this->charset)._M_str = (char *)0x0;
  (this->type)._M_len = 0;
  (this->type)._M_str = (char *)0x0;
  (this->language)._M_len = 0;
  (this->language)._M_str = (char *)0x0;
  this->function = in_function;
  uVar1 = calc_checksum<unsigned_int,std::__cxx11::string>(&this->name);
  this->name_checksum = uVar1;
  return;
}

Assistant:

Jupiter::HTTP::Server::Content::Content(std::string in_name, Jupiter::HTTP::Server::HTTPFunction in_function)
	: name(std::move(in_name)) {
	Jupiter::HTTP::Server::Content::function = in_function;
	Jupiter::HTTP::Server::Content::name_checksum = calc_checksum(name); // switch to calcChecksumi to make case-insensitive
}